

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDiag.cpp
# Opt level: O0

JsErrorCode JsDiagGetSource(uint scriptId,JsValueRef *source)

{
  anon_class_16_2_7cc35364 fn;
  JsErrorCode JVar1;
  JsValueRef *local_18;
  JsValueRef *source_local;
  uint scriptId_local;
  
  fn.scriptId = (uint *)((long)&source_local + 4);
  fn.source = &local_18;
  local_18 = source;
  source_local._4_4_ = scriptId;
  JVar1 = ContextAPIWrapper_NoRecord<false,JsDiagGetSource::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsDiagGetSource(
    _In_ unsigned int scriptId,
    _Out_ JsValueRef *source)
{
#ifndef ENABLE_SCRIPT_DEBUGGING
    return JsErrorCategoryUsage;
#else
    return ContextAPIWrapper_NoRecord<false>([&](Js::ScriptContext *scriptContext) -> JsErrorCode {

        PARAM_NOT_NULL(source);

        *source = JS_INVALID_REFERENCE;

        JsrtContext *currentContext = JsrtContext::GetCurrent();

        JsrtDebugManager* jsrtDebugManager = currentContext->GetRuntime()->GetJsrtDebugManager();

        VALIDATE_IS_DEBUGGING(jsrtDebugManager);

        Js::DynamicObject* sourceObject = jsrtDebugManager->GetSource(scriptContext, scriptId);

        if (sourceObject != nullptr)
        {
            *source = sourceObject;
            return JsNoError;
        }

        return JsErrorInvalidArgument;
    });
#endif
}